

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O1

void __thiscall Expr::~Expr(Expr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ID *this_00;
  ExprList *pEVar2;
  CaseExprList *pCVar3;
  pointer pcVar4;
  pointer ppEVar5;
  pointer ppCVar6;
  
  (this->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Expr_00144b90;
  this_00 = this->id_;
  if (this_00 != (ID *)0x0) {
    ID::~ID(this_00);
    operator_delete(this_00,0x78);
  }
  if (this->operand_[0] != (Expr *)0x0) {
    (*(this->operand_[0]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->operand_[1] != (Expr *)0x0) {
    (*(this->operand_[1]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->operand_[2] != (Expr *)0x0) {
    (*(this->operand_[2]->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->args_ != (ExprList *)0x0) {
    for (ppEVar5 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppEVar5 !=
        (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      if (*ppEVar5 != (Expr *)0x0) {
        (*((*ppEVar5)->super_DataDepElement)._vptr_DataDepElement[1])();
      }
    }
  }
  pEVar2 = this->args_;
  if (pEVar2 != (ExprList *)0x0) {
    ppEVar5 = (pEVar2->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar5 != (pointer)0x0) {
      operator_delete(ppEVar5,(long)(pEVar2->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppEVar5);
    }
    operator_delete(pEVar2,0x18);
  }
  this->args_ = (ExprList *)0x0;
  if (this->cases_ != (CaseExprList *)0x0) {
    for (ppCVar6 = (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppCVar6 !=
        (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar6 = ppCVar6 + 1) {
      if (*ppCVar6 != (CaseExpr *)0x0) {
        (*((*ppCVar6)->super_DataDepElement)._vptr_DataDepElement[1])();
      }
    }
  }
  pCVar3 = this->cases_;
  if (pCVar3 != (CaseExprList *)0x0) {
    ppCVar6 = (pCVar3->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (ppCVar6 != (pointer)0x0) {
      operator_delete(ppCVar6,(long)(pCVar3->
                                    super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppCVar6);
    }
    operator_delete(pCVar3,0x18);
  }
  this->cases_ = (CaseExprList *)0x0;
  pcVar4 = (this->orig_)._M_dataplus._M_p;
  paVar1 = &(this->orig_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->str_)._M_dataplus._M_p;
  paVar1 = &(this->str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Expr::~Expr()
	{
	delete id_;
	delete operand_[0];
	delete operand_[1];
	delete operand_[2];
	delete_list(ExprList, args_);
	delete_list(CaseExprList, cases_);
	}